

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-flat-test.h
# Opt level: O1

string * __thiscall
TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>
::GetConstraintsPrintout_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long lVar1;
  char cVar2;
  string *psVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  ostringstream oss;
  char local_1b1;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar5 = *(long *)((long)this + 0xc0);
  lVar1 = *(long *)((long)this + 200);
  if (lVar5 != lVar1) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Max",3);
      local_1b1 = ' ';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b1,1)
      ;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":  ",3);
      cVar2 = (char)(ostringstream *)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      lVar5 = lVar5 + 0x48;
      iVar6 = iVar6 + 1;
    } while (lVar5 != lVar1);
  }
  psVar3 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string GetConstraintsPrintout() const {
    std::ostringstream oss;
    int i=0;
    for (const auto& con: constr_) {
      oss << con.GetTypeName() << ' ' << (i++)
          << ":  ";
//      con.print(oss);
      oss << std::endl;
    }
    return oss.str();
  }